

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::UnaryUpdate<duckdb::StddevState,double,duckdb::STDDevPopOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  unsigned_long *puVar2;
  long lVar3;
  FunctionData *pFVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  AggregateUnaryInput input_data;
  AggregateUnaryInput local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    lVar13 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar3 = *(long *)(input + 0x28);
      uVar5 = 0;
      uVar6 = 0;
      do {
        if (lVar3 == 0) {
          uVar11 = 0xffffffffffffffff;
        }
        else {
          uVar11 = *(ulong *)(lVar3 + uVar5 * 8);
        }
        uVar8 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar8 = count;
        }
        uVar9 = uVar8;
        if (uVar11 != 0) {
          uVar9 = uVar6;
          if (uVar11 == 0xffffffffffffffff) {
            lVar12 = uVar8 - uVar6;
            if (uVar6 <= uVar8 && lVar12 != 0) {
              dVar16 = *(double *)(state + 8);
              dVar17 = *(double *)(state + 0x10);
              lVar14 = 0;
              do {
                lVar1 = *(long *)state + 1 + lVar14;
                dVar18 = *(double *)(lVar13 + uVar6 * 8 + lVar14 * 8);
                dVar21 = dVar18 - dVar16;
                auVar15._8_4_ = (int)((ulong)lVar1 >> 0x20);
                auVar15._0_8_ = lVar1;
                auVar15._12_4_ = 0x45300000;
                dVar16 = dVar21 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) +
                         dVar16;
                dVar17 = dVar17 + (dVar18 - dVar16) * dVar21;
                lVar14 = lVar14 + 1;
              } while (lVar12 != lVar14);
              *(long *)state = lVar12 + *(long *)state;
              *(double *)(state + 8) = dVar16;
              *(double *)(state + 0x10) = dVar17;
              uVar9 = uVar8;
            }
          }
          else if (uVar6 < uVar8) {
            uVar9 = 0;
            do {
              if ((uVar11 >> (uVar9 & 0x3f) & 1) != 0) {
                lVar12 = *(long *)state + 1;
                *(long *)state = lVar12;
                dVar16 = *(double *)(lVar13 + uVar6 * 8 + uVar9 * 8);
                dVar17 = dVar16 - *(double *)(state + 8);
                auVar19._8_4_ = (int)((ulong)lVar12 >> 0x20);
                auVar19._0_8_ = lVar12;
                auVar19._12_4_ = 0x45300000;
                dVar18 = dVar17 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) +
                         *(double *)(state + 8);
                *(double *)(state + 8) = dVar18;
                *(double *)(state + 0x10) = (dVar16 - dVar18) * dVar17 + *(double *)(state + 0x10);
              }
              uVar9 = uVar9 + 1;
            } while ((uVar6 - uVar8) + uVar9 != 0);
            uVar9 = uVar6 + uVar9;
          }
        }
        uVar6 = uVar9;
        uVar5 = uVar5 + 1;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_68.input_mask = (ValidityMask *)(input + 0x28);
      local_68.input_idx = 0;
      local_68.input = aggr_input_data;
      STDDevBaseOperation::ConstantOperation<double,duckdb::StddevState,duckdb::STDDevPopOperation>
                ((StddevState *)state,*(double **)(input + 0x20),&local_68,count);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_68.input_idx == 0) {
      if (count != 0) {
        pFVar4 = ((local_68.input)->bind_data).ptr;
        dVar16 = *(double *)(state + 8);
        dVar17 = *(double *)(state + 0x10);
        iVar7 = 0;
        do {
          iVar10 = iVar7;
          if (pFVar4 != (FunctionData *)0x0) {
            iVar10 = (idx_t)*(uint *)(pFVar4 + iVar7 * 4);
          }
          lVar13 = *(long *)state + 1 + iVar7;
          puVar2 = (&((local_68.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_mask)[iVar10];
          dVar18 = (double)puVar2 - dVar16;
          auVar22._8_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar22._0_8_ = lVar13;
          auVar22._12_4_ = 0x45300000;
          dVar16 = dVar16 + dVar18 / ((auVar22._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)
                                     );
          dVar17 = dVar17 + ((double)puVar2 - dVar16) * dVar18;
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
        *(idx_t *)state = *(long *)state + count;
        *(double *)(state + 8) = dVar16;
        *(double *)(state + 0x10) = dVar17;
      }
    }
    else if (count != 0) {
      pFVar4 = ((local_68.input)->bind_data).ptr;
      iVar7 = 0;
      do {
        iVar10 = iVar7;
        if (pFVar4 != (FunctionData *)0x0) {
          iVar10 = (idx_t)*(uint *)(pFVar4 + iVar7 * 4);
        }
        if ((*(ulong *)(local_68.input_idx + (iVar10 >> 6) * 8) >> (iVar10 & 0x3f) & 1) != 0) {
          lVar13 = *(long *)state + 1;
          *(long *)state = lVar13;
          puVar2 = (&((local_68.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_mask)[iVar10];
          dVar16 = (double)puVar2 - *(double *)(state + 8);
          auVar20._8_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar20._0_8_ = lVar13;
          auVar20._12_4_ = 0x45300000;
          dVar17 = dVar16 / ((auVar20._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) +
                   *(double *)(state + 8);
          *(double *)(state + 8) = dVar17;
          *(double *)(state + 0x10) = ((double)puVar2 - dVar17) * dVar16 + *(double *)(state + 0x10)
          ;
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}